

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::internal::UntypedMapBase::InsertUniqueInList
          (UntypedMapBase *this,map_index_t b,NodeBase *node)

{
  NodeBase *pNVar1;
  TableEntryPtr TVar2;
  
  TVar2 = this->table_[b];
  if ((TVar2 == 0) || ((uint)(((ulong)this->seed_ ^ (ulong)node) % 0xd) < 7)) {
    pNVar1 = TableEntryToNode(TVar2);
    node->next = pNVar1;
    TVar2 = NodeToTableEntry(node);
    this->table_[b] = TVar2;
  }
  else {
    pNVar1 = TableEntryToNode(TVar2);
    node->next = pNVar1->next;
    pNVar1->next = node;
  }
  return;
}

Assistant:

void InsertUniqueInList(map_index_t b, NodeBase* node) {
    if (!TableEntryIsEmpty(b) && ShouldInsertAfterHead(node)) {
      auto* first = TableEntryToNode(table_[b]);
      node->next = first->next;
      first->next = node;
    } else {
      node->next = TableEntryToNode(table_[b]);
      table_[b] = NodeToTableEntry(node);
    }
  }